

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O1

void huntAndDestroy(QObject *needle,ObjectTreeNode *haystack)

{
  DataList *this;
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  iterator iVar5;
  iterator iVar6;
  ObjectTreeNode *pOVar7;
  ObjectTreeNode *pOVar8;
  ObjectTreeNode *pOVar9;
  ObjectTreeNode *pOVar10;
  long lVar11;
  ObjectTreeNode *node;
  const_iterator abegin;
  
  this = &haystack->children;
  iVar5 = QList<QDBusConnectionPrivate::ObjectTreeNode>::begin(this);
  iVar6 = QList<QDBusConnectionPrivate::ObjectTreeNode>::end(this);
  for (; iVar5.i != iVar6.i; iVar5.i = iVar5.i + 1) {
    huntAndDestroy(needle,iVar5.i);
  }
  pOVar9 = (haystack->children).d.ptr;
  lVar1 = (haystack->children).d.size;
  pOVar10 = pOVar9;
  if (0 < lVar1 >> 2) {
    lVar11 = (lVar1 >> 2) + 1;
    pOVar10 = pOVar9 + 2;
    do {
      pOVar8 = pOVar10;
      if ((pOVar8[-2].field_2.obj == (QObject *)0x0) && (pOVar8[-2].children.d.size == 0)) {
        pOVar8 = pOVar8 + -2;
        goto LAB_00143b56;
      }
      if ((pOVar8[-1].field_2.obj == (QObject *)0x0) && (pOVar8[-1].children.d.size == 0)) {
        pOVar8 = pOVar8 + -1;
        goto LAB_00143b56;
      }
      if (((pOVar8->field_2).obj == (QObject *)0x0) && ((pOVar8->children).d.size == 0))
      goto LAB_00143b56;
      if ((pOVar8[1].field_2.obj == (QObject *)0x0) && (pOVar8[1].children.d.size == 0)) {
        pOVar8 = pOVar8 + 1;
        goto LAB_00143b56;
      }
      lVar11 = lVar11 + -1;
      pOVar10 = pOVar8 + 4;
    } while (1 < lVar11);
    pOVar10 = pOVar8 + 2;
  }
  pOVar7 = pOVar9 + lVar1;
  lVar11 = ((long)pOVar7 - (long)pOVar10 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar11 != 1) {
    pOVar8 = pOVar10;
    if (lVar11 != 2) {
      pOVar8 = pOVar7;
      if ((lVar11 != 3) ||
         (((pOVar10->field_2).obj == (QObject *)0x0 &&
          (pOVar8 = pOVar10, (pOVar10->children).d.size == 0)))) goto LAB_00143b56;
      pOVar8 = pOVar10 + 1;
    }
    if (((pOVar8->field_2).obj == (QObject *)0x0) && ((pOVar8->children).d.size == 0))
    goto LAB_00143b56;
    pOVar10 = pOVar8 + 1;
  }
  pOVar8 = pOVar7;
  if (((pOVar10->field_2).obj == (QObject *)0x0) && ((pOVar10->children).d.size == 0)) {
    pOVar8 = pOVar10;
  }
LAB_00143b56:
  lVar11 = (long)pOVar8 - (long)pOVar9;
  if ((lVar11 >> 3) * 0x2e8ba2e8ba2e8ba3 - lVar1 != 0) {
    iVar5 = QList<QDBusConnectionPrivate::ObjectTreeNode>::end(this);
    iVar6 = QList<QDBusConnectionPrivate::ObjectTreeNode>::begin(this);
    abegin.i = iVar6.i + lVar11;
    pOVar9 = lVar11 + iVar6.i;
    while (pOVar10 = pOVar9, pOVar9 = pOVar10 + 1, pOVar9 != iVar5.i) {
      if ((pOVar10[1].field_2.obj != (QObject *)0x0) || (pOVar10[1].children.d.size != 0)) {
        pDVar2 = ((abegin.i)->name).d.d;
        ((abegin.i)->name).d.d = (pOVar9->name).d.d;
        (pOVar9->name).d.d = pDVar2;
        pcVar3 = ((abegin.i)->name).d.ptr;
        ((abegin.i)->name).d.ptr = pOVar10[1].name.d.ptr;
        pOVar10[1].name.d.ptr = pcVar3;
        qVar4 = ((abegin.i)->name).d.size;
        ((abegin.i)->name).d.size = pOVar10[1].name.d.size;
        pOVar10[1].name.d.size = qVar4;
        pDVar2 = ((abegin.i)->interfaceName).d.d;
        ((abegin.i)->interfaceName).d.d = pOVar10[1].interfaceName.d.d;
        pOVar10[1].interfaceName.d.d = pDVar2;
        pcVar3 = ((abegin.i)->interfaceName).d.ptr;
        ((abegin.i)->interfaceName).d.ptr = pOVar10[1].interfaceName.d.ptr;
        pOVar10[1].interfaceName.d.ptr = pcVar3;
        qVar4 = ((abegin.i)->interfaceName).d.size;
        ((abegin.i)->interfaceName).d.size = pOVar10[1].interfaceName.d.size;
        pOVar10[1].interfaceName.d.size = qVar4;
        ((abegin.i)->flags).super_QFlagsStorageHelper<QDBusConnection::RegisterOption,_4>.
        super_QFlagsStorage<QDBusConnection::RegisterOption>.i =
             pOVar10[1].flags.super_QFlagsStorageHelper<QDBusConnection::RegisterOption,_4>.
             super_QFlagsStorage<QDBusConnection::RegisterOption>.i;
        (abegin.i)->field_2 = pOVar10[1].field_2;
        QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>::operator=
                  (&((abegin.i)->children).d,&pOVar10[1].children.d);
        abegin.i = abegin.i + 1;
      }
    }
    QList<QDBusConnectionPrivate::ObjectTreeNode>::erase(this,abegin,(const_iterator)iVar5.i);
  }
  if ((haystack->field_2).obj == needle) {
    (haystack->field_2).obj = (QObject *)0x0;
    (haystack->flags).super_QFlagsStorageHelper<QDBusConnection::RegisterOption,_4>.
    super_QFlagsStorage<QDBusConnection::RegisterOption>.i = 0;
  }
  return;
}

Assistant:

static void huntAndDestroy(QObject *needle, QDBusConnectionPrivate::ObjectTreeNode &haystack)
{
    for (QDBusConnectionPrivate::ObjectTreeNode &node : haystack.children)
        huntAndDestroy(needle, node);

    auto isInactive = [](const QDBusConnectionPrivate::ObjectTreeNode &node) { return !node.isActive(); };
    haystack.children.removeIf(isInactive);

    if (needle == haystack.obj) {
        haystack.obj = nullptr;
        haystack.flags = {};
    }
}